

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::try_seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *poVar1;
  key_prefix_snapshot kVar2;
  __atomic_base<unsigned_long> _Var3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  value_type vVar9;
  uint8_t uVar10;
  node_type nVar11;
  uint uVar12;
  int iVar13;
  atomic<long> *paVar14;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *this_00;
  uint64_t shifted_key_u64;
  stack_entry *psVar15;
  optimistic_lock *poVar16;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *pbVar17;
  node_ptr nVar18;
  iter_result<unodb::detail::olc_node_header> *piVar19;
  version_type vVar20;
  olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *poVar21;
  find_result fVar22;
  bool local_ac6;
  bool local_ac3;
  bool local_abb;
  bool local_ab9;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *child;
  uchar child_index;
  node_ptr child_1;
  uint8_t child_index_1;
  iter_result<unodb::detail::olc_node_header> *tmp;
  node_ptr nchild_1;
  iter_result_opt cnxt_1;
  olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *icnode_1;
  read_critical_section c_critical_section_1;
  node_ptr cnode_1;
  stack_entry *centry_1;
  iter_result_opt nxt;
  node_ptr child_2;
  uint8_t child_index_2;
  iter_result<unodb::detail::olc_node_header> *tmp_1;
  node_ptr nchild;
  iter_result_opt cnxt;
  olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *icnode;
  read_critical_section c_critical_section;
  node_ptr cnode;
  stack_entry *centry;
  iter_result_opt nxt_1;
  find_result res;
  int cmp__1;
  uint shared_length;
  key_prefix_size key_prefix_length;
  key_prefix_snapshot key_prefix;
  olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *inode;
  pointer pbStack_820;
  int local_818;
  int cmp_;
  __extent_storage<18446744073709551615UL> local_808;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *local_800;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *leaf;
  undefined1 auStack_7f0 [7];
  node_type node_type;
  read_critical_section node_critical_section;
  art_key_type remaining_key;
  art_key_type k;
  basic_node_ptr<unodb::detail::olc_node_header> node;
  undefined1 local_7b0 [8];
  read_critical_section parent_critical_section;
  bool fwd_local;
  bool *match_local;
  iterator *this_local;
  art_key_type search_key_local;
  bool result_30;
  bool result_27;
  bool result_24;
  bool result_21;
  bool result_18;
  bool result_15;
  bool result_12;
  bool result_9;
  bool result_6;
  bool result_3;
  bool result;
  bool result_1;
  bool result_4;
  bool result_7;
  bool result_10;
  bool result_13;
  bool result_16;
  bool result_19;
  bool result_22;
  bool result_25;
  bool result_28;
  bool result_31;
  bool result_32;
  version_type local_4f0;
  version_tag_type local_4e8;
  byte local_4d9;
  olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *poStack_4d8;
  bool result_29;
  version_type local_4d0;
  version_tag_type local_4c8;
  byte local_4b9;
  optimistic_lock *poStack_4b8;
  bool result_26;
  version_type local_4b0;
  version_tag_type local_4a8;
  byte local_499;
  optimistic_lock *poStack_498;
  bool result_23;
  version_type local_490;
  version_tag_type local_488;
  byte local_479;
  optimistic_lock *poStack_478;
  bool result_20;
  version_type local_470;
  version_tag_type local_468;
  byte local_459;
  olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *poStack_458;
  bool result_17;
  version_type local_450;
  version_tag_type local_448;
  byte local_439;
  optimistic_lock *poStack_438;
  bool result_14;
  version_type local_430;
  version_tag_type local_428;
  byte local_419;
  optimistic_lock *poStack_418;
  bool result_11;
  version_type local_410;
  version_tag_type local_408;
  byte local_3f9;
  optimistic_lock *poStack_3f8;
  bool result_8;
  version_type local_3f0;
  version_tag_type local_3e8;
  byte local_3d9;
  optimistic_lock *poStack_3d8;
  bool result_5;
  version_type local_3d0;
  version_tag_type local_3c8;
  byte local_3b9;
  bool result_2;
  version_type local_3b0;
  long local_3a8;
  __int_type_conflict old_value_10;
  long local_398;
  __int_type_conflict old_value_9;
  long local_388;
  __int_type_conflict old_value_8;
  long local_378;
  __int_type_conflict old_value_7;
  long local_368;
  __int_type_conflict old_value_6;
  long local_358;
  __int_type_conflict old_value_5;
  long local_348;
  __int_type_conflict old_value_4;
  long local_338;
  __int_type_conflict old_value_3;
  long local_328;
  __int_type_conflict old_value_2;
  long local_318;
  __int_type_conflict old_value_1;
  long local_308;
  __int_type_conflict old_value;
  long local_2f8;
  memory_order local_2f0;
  int local_2ec;
  memory_order __b;
  long local_2e0;
  memory_order local_2d8;
  int local_2d4;
  memory_order __b_1;
  long local_2c8;
  memory_order local_2c0;
  int local_2bc;
  memory_order __b_2;
  long local_2b0;
  memory_order local_2a8;
  int local_2a4;
  memory_order __b_3;
  long local_298;
  memory_order local_290;
  int local_28c;
  memory_order __b_4;
  long local_280;
  memory_order local_278;
  int local_274;
  memory_order __b_5;
  long local_268;
  memory_order local_260;
  int local_25c;
  memory_order __b_6;
  long local_250;
  memory_order local_248;
  int local_244;
  memory_order __b_7;
  long local_238;
  memory_order local_230;
  int local_22c;
  memory_order __b_8;
  long local_220;
  memory_order local_218;
  int local_214;
  memory_order __b_9;
  long local_208;
  memory_order local_200;
  int local_1fc;
  memory_order __b_10;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  long local_1c0;
  undefined8 local_1b8;
  undefined4 local_1ac;
  undefined8 local_1a8;
  atomic<long> *local_1a0;
  long local_198;
  undefined8 local_190;
  undefined4 local_184;
  undefined8 local_180;
  atomic<long> *local_178;
  long local_170;
  undefined8 local_168;
  undefined4 local_15c;
  undefined8 local_158;
  atomic<long> *local_150;
  long local_148;
  undefined8 local_140;
  undefined4 local_134;
  undefined8 local_130;
  atomic<long> *local_128;
  long local_120;
  undefined8 local_118;
  undefined4 local_10c;
  undefined8 local_108;
  atomic<long> *local_100;
  long local_f8;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined8 local_e0;
  atomic<long> *local_d8;
  long local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  atomic<long> *local_b0;
  long local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  undefined8 local_90;
  atomic<long> *local_88;
  long local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  atomic<long> *local_60;
  long local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  atomic<long> *local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  poVar21 = search_key.field_0._0_8_;
  parent_critical_section.version.version._7_1_ = fwd;
  invalidate(this);
  *match = false;
  optimistic_lock::try_read_lock((optimistic_lock *)local_7b0);
  bVar6 = optimistic_lock::read_critical_section::must_restart((read_critical_section *)local_7b0);
  if (bVar6) {
    spin_wait_loop_body();
    search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
  }
  else {
    k.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)
         in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::load
                   (&this->db_->root);
    bVar6 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                      ((basic_node_ptr<unodb::detail::olc_node_header> *)&k.field_0.key._M_extent,
                       (nullptr_t)0x0);
    if (bVar6) {
      paVar14 = (atomic<long> *)((long)local_7b0 + 8);
      local_2ec = 2;
      ___b = paVar14;
      local_2f0 = std::operator&(acquire,__memory_order_mask);
      if (local_2ec - 1U < 2) {
        local_2f8 = (paVar14->super___atomic_base<long>)._M_i;
      }
      else if (local_2ec == 5) {
        local_2f8 = (paVar14->super___atomic_base<long>)._M_i;
      }
      else {
        local_2f8 = (paVar14->super___atomic_base<long>)._M_i;
      }
      if (local_2f8 < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      local_1ec = 2;
      local_3c8 = (version_tag_type)
                  optimistic_lock::atomic_version_type::load_relaxed
                            ((atomic_version_type *)local_7b0);
      local_3b9 = optimistic_lock::version_type::operator==(&local_3b0,(version_type)local_3c8);
      if (((local_3b9 ^ 0xff) & 1) != 0) {
        optimistic_lock::dec_read_lock_count((optimistic_lock *)local_7b0);
      }
      search_key_local.field_0.key_bytes._M_elems[0xf] = local_3b9 & 1;
      if (search_key_local.field_0.key_bytes._M_elems[0xf] != 0) {
        local_1a0 = (atomic<long> *)((long)local_7b0 + 8);
        local_1a8 = 1;
        local_1ac = 3;
        local_1b8 = 1;
        LOCK();
        local_308 = (local_1a0->super___atomic_base<long>)._M_i;
        (local_1a0->super___atomic_base<long>)._M_i =
             (local_1a0->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        local_1c0 = local_308;
        if (local_308 < 1) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      local_7b0 = (undefined1  [8])0x0;
    }
    else {
      bVar6 = optimistic_lock::read_critical_section::check((read_critical_section *)local_7b0);
      vVar20.version = (version_tag_type)poVar21;
      uVar5 = search_key.field_0._8_8_;
      if (((bVar6 ^ 0xffU) & 1) == 0) {
        do {
          k.field_0.key._M_ptr = (pointer)uVar5;
          node_critical_section.version.version = vVar20.version;
          bVar6 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                            ((basic_node_ptr<unodb::detail::olc_node_header> *)
                             &k.field_0.key._M_extent,(nullptr_t)0x0);
          if (((bVar6 ^ 0xffU) & 1) == 0) {
            __assert_fail("node != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x90a,
                          "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                         );
          }
          detail::node_ptr_lock((olc_node_ptr *)&k.field_0.key._M_extent);
          optimistic_lock::try_read_lock((optimistic_lock *)auStack_7f0);
          bVar6 = optimistic_lock::read_critical_section::must_restart
                            ((read_critical_section *)auStack_7f0);
          if (bVar6) {
            search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
            bVar6 = true;
          }
          else {
            bVar6 = optimistic_lock::read_critical_section::check
                              ((read_critical_section *)local_7b0);
            if (((bVar6 ^ 0xffU) & 1) == 0) {
              leaf._7_1_ = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                                     ((basic_node_ptr<unodb::detail::olc_node_header> *)
                                      &k.field_0.key._M_extent);
              auVar4 = local_7b0;
              if (leaf._7_1_ == LEAF) {
                poVar16 = (optimistic_lock *)local_7b0;
                paVar14 = (atomic<long> *)((long)local_7b0 + 8);
                local_2d4 = 2;
                poStack_3d8 = poVar16;
                ___b_1 = paVar14;
                local_2d8 = std::operator&(acquire,__memory_order_mask);
                if (local_2d4 - 1U < 2) {
                  local_2e0 = (paVar14->super___atomic_base<long>)._M_i;
                }
                else if (local_2d4 == 5) {
                  local_2e0 = (paVar14->super___atomic_base<long>)._M_i;
                }
                else {
                  local_2e0 = (paVar14->super___atomic_base<long>)._M_i;
                }
                if (local_2e0 < 1) {
                  __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                }
                local_1e8 = 2;
                local_3e8 = (version_tag_type)
                            optimistic_lock::atomic_version_type::load_relaxed
                                      ((atomic_version_type *)auVar4);
                local_3d9 = optimistic_lock::version_type::operator==
                                      (&local_3d0,(version_type)local_3e8);
                if (((local_3d9 ^ 0xff) & 1) != 0) {
                  optimistic_lock::dec_read_lock_count((optimistic_lock *)auVar4);
                }
                if ((local_3d9 & 1) != 0) {
                  local_178 = (atomic<long> *)((long)auVar4 + 8);
                  local_180 = 1;
                  local_184 = 3;
                  local_190 = 1;
                  LOCK();
                  local_318 = (local_178->super___atomic_base<long>)._M_i;
                  (local_178->super___atomic_base<long>)._M_i =
                       (local_178->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  old_value_1 = (__int_type_conflict)poVar16;
                  local_198 = local_318;
                  if (local_318 < 1) {
                    __assert_fail("old_value > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const")
                    ;
                  }
                }
                local_7b0 = (undefined1  [8])0x0;
                if (((local_3d9 & 1 ^ 0xff) & 1) == 0) {
                  local_800 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
                              ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>*>
                                        ((basic_node_ptr<unodb::detail::olc_node_header> *)
                                         &k.field_0.key._M_extent);
                  local_808._M_extent_value = (size_t)k.field_0.key._M_extent._M_extent_value;
                  bVar6 = try_push_leaf(this,(olc_node_ptr)k.field_0.key._M_extent._M_extent_value,
                                        (read_critical_section *)auStack_7f0);
                  if (((bVar6 ^ 0xffU) & 1) == 0) {
                    pbStack_820 = k.field_0.key._M_ptr;
                    inode = poVar21;
                    local_818 = detail::
                                basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                                ::cmp(local_800,poVar21,k.field_0.key._M_ptr);
                    _Var3._M_i = _auStack_7f0;
                    poVar16 = (optimistic_lock *)_auStack_7f0;
                    paVar14 = (atomic<long> *)(_auStack_7f0 + 8);
                    local_2bc = 2;
                    poStack_3f8 = poVar16;
                    ___b_2 = paVar14;
                    local_2c0 = std::operator&(acquire,__memory_order_mask);
                    if (local_2bc - 1U < 2) {
                      local_2c8 = (paVar14->super___atomic_base<long>)._M_i;
                    }
                    else if (local_2bc == 5) {
                      local_2c8 = (paVar14->super___atomic_base<long>)._M_i;
                    }
                    else {
                      local_2c8 = (paVar14->super___atomic_base<long>)._M_i;
                    }
                    if (local_2c8 < 1) {
                      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const")
                      ;
                    }
                    local_1e4 = 2;
                    local_408 = (version_tag_type)
                                optimistic_lock::atomic_version_type::load_relaxed
                                          ((atomic_version_type *)_Var3._M_i);
                    local_3f9 = optimistic_lock::version_type::operator==
                                          (&local_3f0,(version_type)local_408);
                    if (((local_3f9 ^ 0xff) & 1) != 0) {
                      optimistic_lock::dec_read_lock_count((optimistic_lock *)_Var3._M_i);
                    }
                    if ((local_3f9 & 1) != 0) {
                      local_150 = (atomic<long> *)(_Var3._M_i + 8);
                      local_158 = 1;
                      local_15c = 3;
                      local_168 = 1;
                      LOCK();
                      local_328 = (local_150->super___atomic_base<long>)._M_i;
                      (local_150->super___atomic_base<long>)._M_i =
                           (local_150->super___atomic_base<long>)._M_i + -1;
                      UNLOCK();
                      old_value_2 = (__int_type_conflict)poVar16;
                      local_170 = local_328;
                      if (local_328 < 1) {
                        __assert_fail("old_value > 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                      ,0x343,
                                      "void unodb::optimistic_lock::dec_read_lock_count() const");
                      }
                    }
                    _auStack_7f0 = 0;
                    if (((local_3f9 & 1 ^ 0xff) & 1) == 0) {
                      if (local_818 == 0) {
                        *match = true;
                        search_key_local.field_0.key_bytes._M_elems[0xf] = 1;
                        bVar6 = true;
                      }
                      else if ((parent_critical_section.version.version._7_1_ & 1) == 0) {
                        if (local_818 < 1) {
                          local_abb = try_prior(this);
                        }
                        else {
                          local_abb = true;
                        }
                        search_key_local.field_0.key_bytes._M_elems[0xf] = local_abb;
                        bVar6 = true;
                      }
                      else {
                        if (local_818 < 0) {
                          local_ab9 = true;
                        }
                        else {
                          local_ab9 = try_next(this);
                        }
                        search_key_local.field_0.key_bytes._M_elems[0xf] = local_ab9;
                        bVar6 = true;
                      }
                    }
                    else {
                      search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                      bVar6 = true;
                    }
                  }
                  else {
                    search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                    bVar6 = true;
                  }
                }
                else {
                  search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                  bVar6 = true;
                }
              }
              else {
                if (leaf._7_1_ == LEAF) {
                  __assert_fail("node_type != node_type::LEAF",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x92a,
                                "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                               );
                }
                key_prefix = (key_prefix_snapshot)
                             detail::basic_node_ptr<unodb::detail::olc_node_header>::
                             ptr<unodb::detail::olc_inode<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>*>
                                       ((basic_node_ptr<unodb::detail::olc_node_header> *)
                                        &k.field_0.key._M_extent);
                this_00 = detail::
                          basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                          ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                            *)key_prefix);
                _shared_length =
                     detail::
                     key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                     ::get_snapshot((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                     *)&this_00->f);
                bVar7 = detail::key_prefix_snapshot::length((key_prefix_snapshot *)&shared_length);
                shifted_key_u64 =
                     detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                     get_u64((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                             &node_critical_section.version);
                uVar12 = detail::key_prefix_snapshot::get_shared_length
                                   ((key_prefix_snapshot *)&shared_length,shifted_key_u64);
                if (uVar12 < bVar7) {
                  bVar8 = detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                          ::operator[]((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                        *)&node_critical_section.version,(ulong)uVar12);
                  vVar9 = detail::key_prefix_snapshot::operator[]
                                    ((key_prefix_snapshot *)&shared_length,(ulong)uVar12);
                  iVar13 = (uint)bVar8 - (uint)vVar9;
                  if ((uint)bVar8 == (uint)vVar9) {
                    __assert_fail("cmp_ != 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                  ,0x93b,
                                  "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                                 );
                  }
                  if ((parent_critical_section.version.version._7_1_ & 1) == 0) {
                    if (iVar13 < 0) {
                      bVar6 = try_left_most_traversal
                                        (this,(olc_node_ptr)k.field_0.key._M_extent._M_extent_value,
                                         (read_critical_section *)local_7b0);
                      bVar6 = unlock_and_return((read_critical_section *)auStack_7f0,bVar6);
                      local_ac6 = false;
                      if (bVar6) {
                        local_ac6 = try_prior(this);
                      }
                      search_key_local.field_0.key_bytes._M_elems[0xf] = local_ac6;
                      bVar6 = true;
                    }
                    else {
                      bVar6 = try_right_most_traversal
                                        (this,(olc_node_ptr)k.field_0.key._M_extent._M_extent_value,
                                         (read_critical_section *)local_7b0);
                      search_key_local.field_0.key_bytes._M_elems[0xf] =
                           unlock_and_return((read_critical_section *)auStack_7f0,bVar6);
                      bVar6 = true;
                    }
                  }
                  else if (iVar13 < 0) {
                    bVar6 = try_left_most_traversal
                                      (this,(olc_node_ptr)k.field_0.key._M_extent._M_extent_value,
                                       (read_critical_section *)local_7b0);
                    search_key_local.field_0.key_bytes._M_elems[0xf] =
                         unlock_and_return((read_critical_section *)auStack_7f0,bVar6);
                    bVar6 = true;
                  }
                  else {
                    bVar6 = try_right_most_traversal
                                      (this,(olc_node_ptr)k.field_0.key._M_extent._M_extent_value,
                                       (read_critical_section *)local_7b0);
                    bVar6 = unlock_and_return((read_critical_section *)auStack_7f0,bVar6);
                    local_ac3 = false;
                    if (bVar6) {
                      local_ac3 = try_next(this);
                    }
                    search_key_local.field_0.key_bytes._M_elems[0xf] = local_ac3;
                    bVar6 = true;
                  }
                }
                else {
                  detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                  shift_right((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                              &node_critical_section.version,(ulong)bVar7);
                  nVar11 = leaf._7_1_;
                  kVar2 = key_prefix;
                  bVar8 = detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                          ::operator[]((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                        *)&node_critical_section.version,0);
                  fVar22 = detail::
                           basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                           ::find_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                         *)kVar2,nVar11,bVar8);
                  uVar5 = k.field_0.key._M_extent._M_extent_value;
                  nVar11 = leaf._7_1_;
                  kVar2 = key_prefix;
                  uVar10 = fVar22.first;
                  nxt_1.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                  ._M_engaged = (bool)uVar10;
                  if ((in_critical_section *)fVar22.second == (in_critical_section *)0x0) {
                    if ((parent_critical_section.version.version._7_1_ & 1) == 0) {
                      bVar8 = detail::
                              basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                              operator[]((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                          *)&node_critical_section.version,0);
                      detail::
                      basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      ::lte_key_byte((iter_result_opt *)&centry_1,
                                     (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                      *)kVar2,nVar11,bVar8);
                      bVar6 = std::optional::operator_cast_to_bool((optional *)&centry_1);
                      auVar4 = local_7b0;
                      if (bVar6) {
                        piVar19 = std::
                                  optional<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                  ::value((optional<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                           *)&centry_1);
                        uVar10 = piVar19->child_index;
                        nVar18 = detail::
                                 basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                              *)key_prefix,leaf._7_1_,uVar10);
                        bVar6 = optimistic_lock::read_critical_section::check
                                          ((read_critical_section *)auStack_7f0);
                        auVar4 = local_7b0;
                        if (((bVar6 ^ 0xffU) & 1) == 0) {
                          poVar16 = (optimistic_lock *)local_7b0;
                          paVar14 = (atomic<long> *)((long)local_7b0 + 8);
                          local_1fc = 2;
                          ___b_10 = paVar14;
                          local_200 = std::operator&(acquire,__memory_order_mask);
                          if (local_1fc - 1U < 2) {
                            local_208 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          else if (local_1fc == 5) {
                            local_208 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          else {
                            local_208 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          if (local_208 < 1) {
                            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                          ,0x2f6,
                                          "bool unodb::optimistic_lock::check(version_type) const");
                          }
                          local_1c4 = 2;
                          vVar20 = optimistic_lock::atomic_version_type::load_relaxed
                                             ((atomic_version_type *)auVar4);
                          bVar6 = optimistic_lock::version_type::operator==(&local_4f0,vVar20);
                          if (((bVar6 ^ 0xffU) & 1) != 0) {
                            optimistic_lock::dec_read_lock_count((optimistic_lock *)auVar4);
                          }
                          if (bVar6) {
                            local_10 = (atomic<long> *)((long)auVar4 + 8);
                            local_18 = 1;
                            local_1c = 3;
                            local_28 = 1;
                            LOCK();
                            local_3a8 = (local_10->super___atomic_base<long>)._M_i;
                            (local_10->super___atomic_base<long>)._M_i =
                                 (local_10->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            old_value_10 = (__int_type_conflict)poVar16;
                            local_30 = local_3a8;
                            if (local_3a8 < 1) {
                              __assert_fail("old_value > 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                            ,0x343,
                                            "void unodb::optimistic_lock::dec_read_lock_count() const"
                                           );
                            }
                          }
                          local_7b0 = (undefined1  [8])0x0;
                          if (((bVar6 ^ 0xffU) & 1) == 0) {
                            bVar6 = try_push(this,(olc_node_ptr)
                                                  k.field_0.key._M_extent._M_extent_value,
                                             piVar19->key_byte,uVar10,piVar19->prefix,
                                             (read_critical_section *)auStack_7f0);
                            if (((bVar6 ^ 0xffU) & 1) == 0) {
                              search_key_local.field_0.key_bytes._M_elems[0xf] =
                                   try_right_most_traversal
                                             (this,(olc_node_ptr)nVar18.tagged_ptr,
                                              (read_critical_section *)auStack_7f0);
                              bVar6 = true;
                            }
                            else {
                              search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                              bVar6 = true;
                            }
                          }
                          else {
                            search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                            bVar6 = true;
                          }
                        }
                        else {
                          search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                          bVar6 = true;
                        }
                      }
                      else {
                        poVar16 = (optimistic_lock *)local_7b0;
                        paVar14 = (atomic<long> *)((long)local_7b0 + 8);
                        local_244 = 2;
                        poStack_498 = poVar16;
                        ___b_7 = paVar14;
                        local_248 = std::operator&(acquire,__memory_order_mask);
                        if (local_244 - 1U < 2) {
                          local_250 = (paVar14->super___atomic_base<long>)._M_i;
                        }
                        else if (local_244 == 5) {
                          local_250 = (paVar14->super___atomic_base<long>)._M_i;
                        }
                        else {
                          local_250 = (paVar14->super___atomic_base<long>)._M_i;
                        }
                        if (local_250 < 1) {
                          __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                        ,0x2f6,
                                        "bool unodb::optimistic_lock::check(version_type) const");
                        }
                        local_1d0 = 2;
                        local_4a8 = (version_tag_type)
                                    optimistic_lock::atomic_version_type::load_relaxed
                                              ((atomic_version_type *)auVar4);
                        local_499 = optimistic_lock::version_type::operator==
                                              (&local_490,(version_type)local_4a8);
                        if (((local_499 ^ 0xff) & 1) != 0) {
                          optimistic_lock::dec_read_lock_count((optimistic_lock *)auVar4);
                        }
                        _Var3._M_i = _auStack_7f0;
                        if ((local_499 & 1) != 0) {
                          local_88 = (atomic<long> *)((long)auVar4 + 8);
                          local_90 = 1;
                          local_94 = 3;
                          local_a0 = 1;
                          LOCK();
                          local_378 = (local_88->super___atomic_base<long>)._M_i;
                          (local_88->super___atomic_base<long>)._M_i =
                               (local_88->super___atomic_base<long>)._M_i + -1;
                          UNLOCK();
                          old_value_7 = (__int_type_conflict)poVar16;
                          local_a8 = local_378;
                          if (local_378 < 1) {
                            __assert_fail("old_value > 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                          ,0x343,
                                          "void unodb::optimistic_lock::dec_read_lock_count() const"
                                         );
                          }
                        }
                        local_7b0 = (undefined1  [8])0x0;
                        if (((local_499 & 1 ^ 0xff) & 1) == 0) {
                          poVar16 = (optimistic_lock *)_auStack_7f0;
                          paVar14 = (atomic<long> *)(_auStack_7f0 + 8);
                          local_22c = 2;
                          poStack_4b8 = poVar16;
                          ___b_8 = paVar14;
                          local_230 = std::operator&(acquire,__memory_order_mask);
                          if (local_22c - 1U < 2) {
                            local_238 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          else if (local_22c == 5) {
                            local_238 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          else {
                            local_238 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          if (local_238 < 1) {
                            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                          ,0x2f6,
                                          "bool unodb::optimistic_lock::check(version_type) const");
                          }
                          local_1cc = 2;
                          local_4c8 = (version_tag_type)
                                      optimistic_lock::atomic_version_type::load_relaxed
                                                ((atomic_version_type *)_Var3._M_i);
                          local_4b9 = optimistic_lock::version_type::operator==
                                                (&local_4b0,(version_type)local_4c8);
                          if (((local_4b9 ^ 0xff) & 1) != 0) {
                            optimistic_lock::dec_read_lock_count((optimistic_lock *)_Var3._M_i);
                          }
                          if ((local_4b9 & 1) != 0) {
                            local_60 = (atomic<long> *)(_Var3._M_i + 8);
                            local_68 = 1;
                            local_6c = 3;
                            local_78 = 1;
                            LOCK();
                            local_388 = (local_60->super___atomic_base<long>)._M_i;
                            (local_60->super___atomic_base<long>)._M_i =
                                 (local_60->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            old_value_8 = (__int_type_conflict)poVar16;
                            local_80 = local_388;
                            if (local_388 < 1) {
                              __assert_fail("old_value > 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                            ,0x343,
                                            "void unodb::optimistic_lock::dec_read_lock_count() const"
                                           );
                            }
                          }
                          _auStack_7f0 = 0;
                          if (((local_4b9 & 1 ^ 0xff) & 1) == 0) {
                            bVar6 = empty(this);
                            if (!bVar6) {
                              pop(this);
                            }
                            do {
                              bVar6 = empty(this);
                              if (((bVar6 ^ 0xffU) & 1) == 0) {
                                search_key_local.field_0.key_bytes._M_elems[0xf] = 1;
                                bVar6 = true;
                                break;
                              }
                              psVar15 = top(this);
                              c_critical_section_1.version.version =
                                   (psVar15->super_iter_result).node.tagged_ptr;
                              poVar16 = detail::node_ptr_lock
                                                  ((olc_node_ptr *)&c_critical_section_1.version);
                              optimistic_lock::rehydrate_read_lock
                                        ((optimistic_lock *)&icnode_1,(version_tag_type)poVar16);
                              bVar6 = optimistic_lock::read_critical_section::check
                                                ((read_critical_section *)&icnode_1);
                              if (((bVar6 ^ 0xffU) & 1) == 0) {
                                pbVar17 = &detail::basic_node_ptr<unodb::detail::olc_node_header>::
                                           ptr<unodb::detail::olc_inode<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>*>
                                                     ((
                                                  basic_node_ptr<unodb::detail::olc_node_header> *)
                                                  &c_critical_section_1.version)->
                                           super_olc_inode_base<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                ;
                                nVar11 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
                                         type((basic_node_ptr<unodb::detail::olc_node_header> *)
                                              &c_critical_section_1.version);
                                detail::
                                basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                ::prior((iter_result_opt *)&nchild_1,pbVar17,nVar11,
                                        (psVar15->super_iter_result).child_index);
                                bVar6 = std::optional::operator_cast_to_bool((optional *)&nchild_1);
                                if (bVar6) {
                                  nVar11 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
                                           type((basic_node_ptr<unodb::detail::olc_node_header> *)
                                                &c_critical_section_1.version);
                                  nVar18 = detail::
                                           basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                           ::get_child(pbVar17,nVar11,
                                                       (psVar15->super_iter_result).child_index);
                                  bVar6 = optimistic_lock::read_critical_section::check
                                                    ((read_critical_section *)&icnode_1);
                                  if (((bVar6 ^ 0xffU) & 1) == 0) {
                                    search_key_local.field_0.key_bytes._M_elems[0xf] =
                                         try_right_most_traversal
                                                   (this,(olc_node_ptr)nVar18.tagged_ptr,
                                                    (read_critical_section *)&icnode_1);
                                    bVar6 = true;
                                  }
                                  else {
                                    search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                                    bVar6 = true;
                                  }
                                }
                                else {
                                  pop(this);
                                  poVar1 = icnode_1;
                                  paVar14 = &(icnode_1->
                                             super_olc_inode_base<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                             ).super_header_type.m_lock.read_lock_count;
                                  local_214 = 2;
                                  poStack_4d8 = poVar1;
                                  ___b_9 = paVar14;
                                  local_218 = std::operator&(acquire,__memory_order_mask);
                                  if (local_214 - 1U < 2) {
                                    local_220 = (paVar14->super___atomic_base<long>)._M_i;
                                  }
                                  else if (local_214 == 5) {
                                    local_220 = (paVar14->super___atomic_base<long>)._M_i;
                                  }
                                  else {
                                    local_220 = (paVar14->super___atomic_base<long>)._M_i;
                                  }
                                  if (local_220 < 1) {
                                    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                                  ,0x2f6,
                                                  "bool unodb::optimistic_lock::check(version_type) const"
                                                 );
                                  }
                                  local_1c8 = 2;
                                  local_4e8 = (version_tag_type)
                                              optimistic_lock::atomic_version_type::load_relaxed
                                                        ((atomic_version_type *)poVar1);
                                  local_4d9 = optimistic_lock::version_type::operator==
                                                        (&local_4d0,(version_type)local_4e8);
                                  if (((local_4d9 ^ 0xff) & 1) != 0) {
                                    optimistic_lock::dec_read_lock_count((optimistic_lock *)poVar1);
                                  }
                                  if ((local_4d9 & 1) != 0) {
                                    local_38 = &(poVar1->
                                                super_olc_inode_base<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                                ).super_header_type.m_lock.read_lock_count;
                                    local_40 = 1;
                                    local_44 = 3;
                                    local_50 = 1;
                                    LOCK();
                                    local_398 = (local_38->super___atomic_base<long>)._M_i;
                                    (local_38->super___atomic_base<long>)._M_i =
                                         (local_38->super___atomic_base<long>)._M_i + -1;
                                    UNLOCK();
                                    old_value_9 = (__int_type_conflict)poVar1;
                                    local_58 = local_398;
                                    if (local_398 < 1) {
                                      __assert_fail("old_value > 0",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                                  ,0x343,
                                                  "void unodb::optimistic_lock::dec_read_lock_count() const"
                                                  );
                                    }
                                  }
                                  icnode_1 = (olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                                              *)0x0;
                                  if (((local_4d9 & 1 ^ 0xff) & 1) == 0) {
                                    bVar6 = false;
                                  }
                                  else {
                                    search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                                    bVar6 = true;
                                  }
                                }
                              }
                              else {
                                search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                                bVar6 = true;
                              }
                              optimistic_lock::read_critical_section::~read_critical_section
                                        ((read_critical_section *)&icnode_1);
                            } while (!bVar6);
                          }
                          else {
                            search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                            bVar6 = true;
                          }
                        }
                        else {
                          search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                          bVar6 = true;
                        }
                      }
                    }
                    else {
                      bVar8 = detail::
                              basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                              operator[]((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                          *)&node_critical_section.version,0);
                      detail::
                      basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      ::gte_key_byte((iter_result_opt *)&centry,
                                     (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                      *)kVar2,nVar11,bVar8);
                      bVar6 = std::optional::operator_cast_to_bool((optional *)&centry);
                      auVar4 = local_7b0;
                      if (bVar6) {
                        piVar19 = std::
                                  optional<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                  ::value((optional<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                           *)&centry);
                        uVar10 = piVar19->child_index;
                        nVar18 = detail::
                                 basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                              *)key_prefix,leaf._7_1_,uVar10);
                        bVar6 = optimistic_lock::read_critical_section::check
                                          ((read_critical_section *)auStack_7f0);
                        auVar4 = local_7b0;
                        if (((bVar6 ^ 0xffU) & 1) == 0) {
                          poVar16 = (optimistic_lock *)local_7b0;
                          paVar14 = (atomic<long> *)((long)local_7b0 + 8);
                          local_25c = 2;
                          poStack_478 = poVar16;
                          ___b_6 = paVar14;
                          local_260 = std::operator&(acquire,__memory_order_mask);
                          if (local_25c - 1U < 2) {
                            local_268 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          else if (local_25c == 5) {
                            local_268 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          else {
                            local_268 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          if (local_268 < 1) {
                            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                          ,0x2f6,
                                          "bool unodb::optimistic_lock::check(version_type) const");
                          }
                          local_1d4 = 2;
                          local_488 = (version_tag_type)
                                      optimistic_lock::atomic_version_type::load_relaxed
                                                ((atomic_version_type *)auVar4);
                          local_479 = optimistic_lock::version_type::operator==
                                                (&local_470,(version_type)local_488);
                          if (((local_479 ^ 0xff) & 1) != 0) {
                            optimistic_lock::dec_read_lock_count((optimistic_lock *)auVar4);
                          }
                          if ((local_479 & 1) != 0) {
                            local_b0 = (atomic<long> *)((long)auVar4 + 8);
                            local_b8 = 1;
                            local_bc = 3;
                            local_c8 = 1;
                            LOCK();
                            local_368 = (local_b0->super___atomic_base<long>)._M_i;
                            (local_b0->super___atomic_base<long>)._M_i =
                                 (local_b0->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            old_value_6 = (__int_type_conflict)poVar16;
                            local_d0 = local_368;
                            if (local_368 < 1) {
                              __assert_fail("old_value > 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                            ,0x343,
                                            "void unodb::optimistic_lock::dec_read_lock_count() const"
                                           );
                            }
                          }
                          local_7b0 = (undefined1  [8])0x0;
                          if (((local_479 & 1 ^ 0xff) & 1) == 0) {
                            bVar6 = try_push(this,(olc_node_ptr)
                                                  k.field_0.key._M_extent._M_extent_value,
                                             piVar19->key_byte,uVar10,piVar19->prefix,
                                             (read_critical_section *)auStack_7f0);
                            if (((bVar6 ^ 0xffU) & 1) == 0) {
                              nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                              ._24_8_ = nVar18;
                              search_key_local.field_0.key_bytes._M_elems[0xf] =
                                   try_left_most_traversal
                                             (this,(olc_node_ptr)nVar18.tagged_ptr,
                                              (read_critical_section *)auStack_7f0);
                              bVar6 = true;
                            }
                            else {
                              search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                              bVar6 = true;
                            }
                          }
                          else {
                            search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                            bVar6 = true;
                          }
                        }
                        else {
                          search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                          bVar6 = true;
                        }
                      }
                      else {
                        poVar16 = (optimistic_lock *)local_7b0;
                        paVar14 = (atomic<long> *)((long)local_7b0 + 8);
                        local_2a4 = 2;
                        poStack_418 = poVar16;
                        ___b_3 = paVar14;
                        local_2a8 = std::operator&(acquire,__memory_order_mask);
                        if (local_2a4 - 1U < 2) {
                          local_2b0 = (paVar14->super___atomic_base<long>)._M_i;
                        }
                        else if (local_2a4 == 5) {
                          local_2b0 = (paVar14->super___atomic_base<long>)._M_i;
                        }
                        else {
                          local_2b0 = (paVar14->super___atomic_base<long>)._M_i;
                        }
                        if (local_2b0 < 1) {
                          __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                        ,0x2f6,
                                        "bool unodb::optimistic_lock::check(version_type) const");
                        }
                        local_1e0 = 2;
                        local_428 = (version_tag_type)
                                    optimistic_lock::atomic_version_type::load_relaxed
                                              ((atomic_version_type *)auVar4);
                        local_419 = optimistic_lock::version_type::operator==
                                              (&local_410,(version_type)local_428);
                        if (((local_419 ^ 0xff) & 1) != 0) {
                          optimistic_lock::dec_read_lock_count((optimistic_lock *)auVar4);
                        }
                        _Var3._M_i = _auStack_7f0;
                        if ((local_419 & 1) != 0) {
                          local_128 = (atomic<long> *)((long)auVar4 + 8);
                          local_130 = 1;
                          local_134 = 3;
                          local_140 = 1;
                          LOCK();
                          local_338 = (local_128->super___atomic_base<long>)._M_i;
                          (local_128->super___atomic_base<long>)._M_i =
                               (local_128->super___atomic_base<long>)._M_i + -1;
                          UNLOCK();
                          old_value_3 = (__int_type_conflict)poVar16;
                          local_148 = local_338;
                          if (local_338 < 1) {
                            __assert_fail("old_value > 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                          ,0x343,
                                          "void unodb::optimistic_lock::dec_read_lock_count() const"
                                         );
                          }
                        }
                        local_7b0 = (undefined1  [8])0x0;
                        if (((local_419 & 1 ^ 0xff) & 1) == 0) {
                          poVar16 = (optimistic_lock *)_auStack_7f0;
                          paVar14 = (atomic<long> *)(_auStack_7f0 + 8);
                          local_28c = 2;
                          poStack_438 = poVar16;
                          ___b_4 = paVar14;
                          local_290 = std::operator&(acquire,__memory_order_mask);
                          if (local_28c - 1U < 2) {
                            local_298 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          else if (local_28c == 5) {
                            local_298 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          else {
                            local_298 = (paVar14->super___atomic_base<long>)._M_i;
                          }
                          if (local_298 < 1) {
                            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                          ,0x2f6,
                                          "bool unodb::optimistic_lock::check(version_type) const");
                          }
                          local_1dc = 2;
                          local_448 = (version_tag_type)
                                      optimistic_lock::atomic_version_type::load_relaxed
                                                ((atomic_version_type *)_Var3._M_i);
                          local_439 = optimistic_lock::version_type::operator==
                                                (&local_430,(version_type)local_448);
                          if (((local_439 ^ 0xff) & 1) != 0) {
                            optimistic_lock::dec_read_lock_count((optimistic_lock *)_Var3._M_i);
                          }
                          if ((local_439 & 1) != 0) {
                            local_100 = (atomic<long> *)(_Var3._M_i + 8);
                            local_108 = 1;
                            local_10c = 3;
                            local_118 = 1;
                            LOCK();
                            local_348 = (local_100->super___atomic_base<long>)._M_i;
                            (local_100->super___atomic_base<long>)._M_i =
                                 (local_100->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            old_value_4 = (__int_type_conflict)poVar16;
                            local_120 = local_348;
                            if (local_348 < 1) {
                              __assert_fail("old_value > 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                            ,0x343,
                                            "void unodb::optimistic_lock::dec_read_lock_count() const"
                                           );
                            }
                          }
                          _auStack_7f0 = 0;
                          if (((local_439 & 1 ^ 0xff) & 1) == 0) {
                            bVar6 = empty(this);
                            if (!bVar6) {
                              pop(this);
                            }
                            do {
                              bVar6 = empty(this);
                              if (((bVar6 ^ 0xffU) & 1) == 0) {
                                search_key_local.field_0.key_bytes._M_elems[0xf] = 1;
                                bVar6 = true;
                                break;
                              }
                              psVar15 = top(this);
                              c_critical_section.version.version =
                                   (psVar15->super_iter_result).node.tagged_ptr;
                              poVar16 = detail::node_ptr_lock
                                                  ((olc_node_ptr *)&c_critical_section.version);
                              optimistic_lock::rehydrate_read_lock
                                        ((optimistic_lock *)&icnode,(version_tag_type)poVar16);
                              bVar6 = optimistic_lock::read_critical_section::check
                                                ((read_critical_section *)&icnode);
                              if (((bVar6 ^ 0xffU) & 1) == 0) {
                                pbVar17 = &detail::basic_node_ptr<unodb::detail::olc_node_header>::
                                           ptr<unodb::detail::olc_inode<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>*>
                                                     ((
                                                  basic_node_ptr<unodb::detail::olc_node_header> *)
                                                  &c_critical_section.version)->
                                           super_olc_inode_base<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                ;
                                nVar11 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
                                         type((basic_node_ptr<unodb::detail::olc_node_header> *)
                                              &c_critical_section.version);
                                detail::
                                basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                ::next((iter_result_opt *)&nchild,pbVar17,nVar11,
                                       (psVar15->super_iter_result).child_index);
                                bVar6 = std::optional::operator_cast_to_bool((optional *)&nchild);
                                if (bVar6) {
                                  nVar11 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
                                           type((basic_node_ptr<unodb::detail::olc_node_header> *)
                                                &c_critical_section.version);
                                  nVar18 = detail::
                                           basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                           ::get_child(pbVar17,nVar11,
                                                       (psVar15->super_iter_result).child_index);
                                  bVar6 = optimistic_lock::read_critical_section::check
                                                    ((read_critical_section *)&icnode);
                                  if (((bVar6 ^ 0xffU) & 1) == 0) {
                                    search_key_local.field_0.key_bytes._M_elems[0xf] =
                                         try_left_most_traversal
                                                   (this,(olc_node_ptr)nVar18.tagged_ptr,
                                                    (read_critical_section *)&icnode);
                                    bVar6 = true;
                                  }
                                  else {
                                    search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                                    bVar6 = true;
                                  }
                                }
                                else {
                                  pop(this);
                                  poVar1 = icnode;
                                  paVar14 = &(icnode->
                                             super_olc_inode_base<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                             ).super_header_type.m_lock.read_lock_count;
                                  local_274 = 2;
                                  poStack_458 = poVar1;
                                  ___b_5 = paVar14;
                                  local_278 = std::operator&(acquire,__memory_order_mask);
                                  if (local_274 - 1U < 2) {
                                    local_280 = (paVar14->super___atomic_base<long>)._M_i;
                                  }
                                  else if (local_274 == 5) {
                                    local_280 = (paVar14->super___atomic_base<long>)._M_i;
                                  }
                                  else {
                                    local_280 = (paVar14->super___atomic_base<long>)._M_i;
                                  }
                                  if (local_280 < 1) {
                                    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                                  ,0x2f6,
                                                  "bool unodb::optimistic_lock::check(version_type) const"
                                                 );
                                  }
                                  local_1d8 = 2;
                                  local_468 = (version_tag_type)
                                              optimistic_lock::atomic_version_type::load_relaxed
                                                        ((atomic_version_type *)poVar1);
                                  local_459 = optimistic_lock::version_type::operator==
                                                        (&local_450,(version_type)local_468);
                                  if (((local_459 ^ 0xff) & 1) != 0) {
                                    optimistic_lock::dec_read_lock_count((optimistic_lock *)poVar1);
                                  }
                                  if ((local_459 & 1) != 0) {
                                    local_d8 = &(poVar1->
                                                super_olc_inode_base<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                                ).super_header_type.m_lock.read_lock_count;
                                    local_e0 = 1;
                                    local_e4 = 3;
                                    local_f0 = 1;
                                    LOCK();
                                    local_358 = (local_d8->super___atomic_base<long>)._M_i;
                                    (local_d8->super___atomic_base<long>)._M_i =
                                         (local_d8->super___atomic_base<long>)._M_i + -1;
                                    UNLOCK();
                                    old_value_5 = (__int_type_conflict)poVar1;
                                    local_f8 = local_358;
                                    if (local_358 < 1) {
                                      __assert_fail("old_value > 0",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                                  ,0x343,
                                                  "void unodb::optimistic_lock::dec_read_lock_count() const"
                                                  );
                                    }
                                  }
                                  icnode = (olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                                            *)0x0;
                                  if (((local_459 & 1 ^ 0xff) & 1) == 0) {
                                    bVar6 = false;
                                  }
                                  else {
                                    search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                                    bVar6 = true;
                                  }
                                }
                              }
                              else {
                                search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                                bVar6 = true;
                              }
                              optimistic_lock::read_critical_section::~read_critical_section
                                        ((read_critical_section *)&icnode);
                            } while (!bVar6);
                          }
                          else {
                            search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                            bVar6 = true;
                          }
                        }
                        else {
                          search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                          bVar6 = true;
                        }
                      }
                    }
                  }
                  else {
                    bVar8 = detail::
                            basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                            operator[]((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                        *)&node_critical_section.version,0);
                    bVar6 = try_push(this,(olc_node_ptr)uVar5,bVar8,uVar10,_shared_length,
                                     (read_critical_section *)auStack_7f0);
                    if (((bVar6 ^ 0xffU) & 1) == 0) {
                      k.field_0.key._M_extent._M_extent_value =
                           (__extent_storage<18446744073709551615UL>)
                           in_critical_section::operator_cast_to_basic_node_ptr
                                     ((in_critical_section *)fVar22.second);
                      detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                      shift_right((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                   *)&node_critical_section.version,1);
                      bVar6 = optimistic_lock::read_critical_section::check
                                        ((read_critical_section *)auStack_7f0);
                      if (((bVar6 ^ 0xffU) & 1) == 0) {
                        optimistic_lock::read_critical_section::operator=
                                  ((read_critical_section *)local_7b0,
                                   (read_critical_section *)auStack_7f0);
                        bVar6 = false;
                      }
                      else {
                        search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                        bVar6 = true;
                      }
                    }
                    else {
                      search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
                      bVar6 = true;
                    }
                  }
                }
              }
            }
            else {
              search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
              bVar6 = true;
            }
          }
          optimistic_lock::read_critical_section::~read_critical_section
                    ((read_critical_section *)auStack_7f0);
          vVar20 = node_critical_section.version;
          uVar5 = k.field_0.key._M_ptr;
        } while (!bVar6);
      }
      else {
        spin_wait_loop_body();
        search_key_local.field_0.key_bytes._M_elems[0xf] = 0;
      }
    }
  }
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_7b0)
  ;
  return (bool)(search_key_local.field_0.key_bytes._M_elems[0xf] & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_seek(art_key_type search_key,
                                            bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  const auto k = search_key;
  auto remaining_key{k};
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    // TODO(thompsonbry) Should be redundant.  Checked before entering
    // the while() loop and at the bottom of the while() loop.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return false;
    // Note: We DO NOT unlock the parent_critical_section here.  It is
    // done below along all code paths.
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      const auto cmp_ = leaf->cmp(k);
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      if (cmp_ == 0) {
        match = true;
        return true;  // done
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use leaf, else next().
        return (cmp_ < 0) ? true : try_next();
      }
      // LTE semantics: if search_key > leaf, use leaf, else prior().
      return (cmp_ > 0) ? true : try_prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        // Note: parent_critical_section is unlocked along all paths
        // by try_(left|right)_most_traversal
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return unlock_and_return(
              node_critical_section,
              try_left_most_traversal(node, parent_critical_section));
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return unlock_and_return(
                   node_critical_section,
                   try_right_most_traversal(node, parent_critical_section)) &&
               try_next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return unlock_and_return(
                   node_critical_section,
                   try_left_most_traversal(node, parent_critical_section)) &&
               try_prior();
      }
      // REV and the search key is ordered after this node.
      return unlock_and_return(
          node_critical_section,
          try_right_most_traversal(node, parent_critical_section));
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (UNODB_DETAIL_UNLIKELY(
                  !parent_critical_section.try_read_unlock()))  // unlock parent
            return false;  // LCOV_EXCL_LINE
          if (UNODB_DETAIL_UNLIKELY(
                  !node_critical_section.try_read_unlock()))  // unlock node
            return false;                                     // LCOV_EXCL_LINE
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // a possible parent from the stack.
            auto c_critical_section(
                node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
              return false;  // LCOV_EXCL_LINE
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(
                  cnode.type(), centry.child_index);  // get the child
              if (UNODB_DETAIL_UNLIKELY(
                      !c_critical_section.check()))  // before using [nchild]
                return false;                        // LCOV_EXCL_LINE
              return try_left_most_traversal(nchild, c_critical_section);
            }
            pop();
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
              return false;  // LCOV_EXCL_LINE
          }
          return true;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child =
            inode->get_child(node_type, child_index);  // get child
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.check()))  // before using [child]
          return false;                           // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        // push the path we took
        if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                            tmp.prefix, node_critical_section)))
          return false;  // LCOV_EXCL_LINE
        return try_left_most_traversal(child, node_critical_section);
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.try_read_unlock()))  // unlock node
          return false;                                     // LCOV_EXCL_LINE
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // a possible parent from stack
          auto c_critical_section(
              node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
            return false;  // LCOV_EXCL_LINE
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(
                cnode.type(), centry.child_index);  // get the child
            if (UNODB_DETAIL_UNLIKELY(
                    !c_critical_section.check()))  // before using [nchild]
              return false;                        // LCOV_EXCL_LINE
            return try_right_most_traversal(nchild, c_critical_section);
          }
          pop();
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
            return false;  // LCOV_EXCL_LINE
        }
        return true;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index = tmp.child_index;
      const auto child =
          inode->get_child(node_type, child_index);  // get the child
      if (UNODB_DETAIL_UNLIKELY(
              !node_critical_section.check()))  // before using [child]
        return false;                           // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      // push the path we took
      if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                          tmp.prefix, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return try_right_most_traversal(child, node_critical_section);
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    if (UNODB_DETAIL_UNLIKELY(!try_push(node, remaining_key[0], child_index,
                                        key_prefix, node_critical_section)))
      return false;  // LCOV_EXCL_LINE
    node = *child;
    remaining_key.shift_right(1);
    // check node before using [child] and before we std::move() the RCS.
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}